

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

int Gia_QbfSolve(Gia_Man_t *pGia,int nPars,int nIterLimit,int nConfLimit,int nTimeOut,int nEncVars,
                int fGlucose,int fVerbose)

{
  Vec_Int_t *pVVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Qbf_Man_t *p;
  int *piVar8;
  Gia_Man_t *pCof;
  undefined8 extraout_RAX;
  ulong uVar9;
  ulong extraout_RAX_00;
  long lVar10;
  long lVar11;
  char *pcVar12;
  uint Iter;
  Gia_Man_t *pGVar13;
  int iVar14;
  bool bVar15;
  timespec local_78;
  undefined4 local_64;
  double local_60;
  int local_54;
  Gia_Man_t *local_50;
  uint local_48;
  uint local_44;
  long local_40;
  long local_38;
  
  local_60 = (double)CONCAT44(local_60._4_4_,nTimeOut);
  pGVar13 = (Gia_Man_t *)(ulong)(uint)nIterLimit;
  p = Gia_QbfAlloc(pGia,nPars,fGlucose,fVerbose);
  if (fVerbose != 0) {
    printf("Solving QBF for \"%s\" with %d parameters, %d variables and %d AIG nodes.\n",pGia->pName
           ,(ulong)(uint)p->nPars,(ulong)(uint)p->nVars);
  }
  local_50 = pGia;
  if (pGia->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                  ,0x34a,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
  }
  pVVar1 = p->vValues;
  if (pVVar1->nCap < nPars) {
    if (pVVar1->pArray == (int *)0x0) {
      piVar8 = (int *)malloc((long)nPars << 2);
    }
    else {
      piVar8 = (int *)realloc(pVVar1->pArray,(long)nPars << 2);
    }
    pVVar1->pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar1->nCap = nPars;
  }
  if (0 < nPars) {
    memset(pVVar1->pArray,0,(ulong)(uint)nPars << 2);
  }
  pVVar1->nSize = nPars;
  local_54 = nEncVars;
  iVar5 = Gia_QbfVerify(p,p->vValues);
  local_40 = (long)local_60._0_4_;
  bVar15 = iVar5 == 0;
  local_48 = nConfLimit;
  if (bVar15) {
    Iter = 0;
    local_64 = 0;
  }
  else {
    local_38 = (long)nConfLimit;
    local_44 = nIterLimit - 1;
    Iter = 0;
    do {
      if (p->vValues->nSize != p->nVars) {
        __assert_fail("Vec_IntSize(p->vValues) == p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                      ,0x34f,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
      }
      pCof = Gia_QbfCofactor(local_50,nPars,p->vValues,p->vParMap);
      if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
        iVar5 = Gia_QbfAddCofactor(p,pCof);
      }
      else {
        iVar5 = Gia_QbfAddCofactorG(p,pCof);
      }
      Gia_ManStop(pCof);
      iVar14 = 1;
      local_64 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),iVar5 == 0);
      if (iVar5 == 0) {
LAB_0079740a:
        bVar4 = 0;
        goto LAB_00797420;
      }
      iVar5 = clock_gettime(3,&local_78);
      if (iVar5 < 0) {
        lVar10 = 1;
      }
      else {
        lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
        lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_78.tv_sec * -1000000;
      }
      if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
        iVar5 = sat_solver_solve(p->pSatSyn,(lit *)0x0,(lit *)0x0,local_38,0,0,0);
      }
      else {
        iVar5 = bmcg_sat_solver_solve(p->pSatSynG,(int *)0x0,0);
      }
      uVar6 = clock_gettime(3,&local_78);
      uVar9 = (ulong)uVar6;
      if ((int)uVar6 < 0) {
        lVar11 = -1;
      }
      else {
        uVar9 = local_78.tv_sec * 1000000;
        lVar11 = local_78.tv_nsec / 1000 + uVar9;
      }
      p->clkSat = p->clkSat + lVar11 + lVar10;
      if (fVerbose != 0) {
        Gia_QbfPrint(p,p->vValues,Iter);
        uVar9 = extraout_RAX_00;
      }
      if (iVar5 == -1) {
        local_64 = (undefined4)CONCAT71((int7)(uVar9 >> 8),1);
        goto LAB_0079740a;
      }
      if (iVar5 == 0) {
        iVar14 = -1;
        bVar4 = 1;
        goto LAB_00797420;
      }
      Gia_QbfOnePattern(p,p->vValues);
      if (p->vValues->nSize != p->nPars) {
        __assert_fail("Vec_IntSize(p->vValues) == p->nPars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                      ,0x361,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
      }
      iVar14 = -1;
      bVar4 = 1;
      if (nIterLimit != 0 && local_44 == Iter) goto LAB_00797420;
      if (local_60._0_4_ != 0) {
        iVar5 = clock_gettime(3,&local_78);
        if (iVar5 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
        }
        if (local_40 <= (lVar10 - p->clkStart) / 1000000) goto LAB_00797420;
      }
      iVar5 = Gia_QbfVerify(p,p->vValues);
      Iter = Iter + 1;
      bVar15 = iVar5 == 0;
    } while (!bVar15);
  }
  bVar4 = 0;
  iVar14 = 0;
LAB_00797420:
  if (bVar15) {
    lVar10 = (long)p->vValues->nSize;
    if (lVar10 < 1) {
      uVar6 = 0;
    }
    else {
      lVar11 = 0;
      uVar6 = 0;
      do {
        uVar6 = uVar6 + (p->vValues->pArray[lVar11] == 0);
        lVar11 = lVar11 + 1;
      } while (lVar10 != lVar11);
    }
    local_50 = pGVar13;
    printf("Parameters: ");
    pVVar1 = p->vValues;
    if (pVVar1->nSize != nPars) {
      __assert_fail("Vec_IntSize(p->vValues) == nPars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                    ,0x36c,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
    }
    if (0 < pVVar1->nSize) {
      lVar10 = 0;
      do {
        printf("%d",(ulong)(pVVar1->pArray[lVar10] != 0));
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar1->nSize);
    }
    printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar6,(ulong)(p->vValues->nSize - uVar6));
    pGVar13 = local_50;
    if (local_54 != 0) {
      iVar5 = p->vValues->nSize;
      iVar7 = iVar5 / (1 << ((byte)local_54 & 0x1f));
      if (iVar5 != iVar7 << ((byte)local_54 & 0x1f)) {
        __assert_fail("Vec_IntSize(p->vValues) == (1 << nEncVars) * nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                      ,0x372,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
      }
      Gia_Gen2CodePrint(local_54,iVar7,p->vValues);
    }
  }
  bVar15 = (bool)(bVar4 ^ 1);
  if (local_60._0_4_ != 0 && !bVar15) {
    iVar5 = clock_gettime(3,&local_78);
    if (iVar5 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    if (local_40 <= (lVar10 - p->clkStart) / 1000000) {
      pcVar12 = "The problem timed out after %d sec.  ";
      uVar9 = (ulong)local_60 & 0xffffffff;
      goto LAB_007975e3;
    }
  }
  uVar9 = (ulong)local_48;
  if (local_48 == 0 || bVar15) {
    if ((int)pGVar13 == 0 || bVar15) {
      if ((char)local_64 == '\0') {
        pcVar12 = "The problem is SAT after %d iterations.  ";
      }
      else {
        pcVar12 = "The problem is UNSAT after %d iterations.  ";
      }
      uVar9 = (ulong)Iter;
    }
    else {
      pcVar12 = "The problem aborted after %d iterations.  ";
      uVar9 = (ulong)pGVar13 & 0xffffffff;
    }
  }
  else {
    pcVar12 = "The problem aborted after %d conflicts.  ";
  }
LAB_007975e3:
  printf(pcVar12,uVar9);
  if (fVerbose == 0) {
    iVar7 = 3;
    iVar5 = clock_gettime(3,&local_78);
    if (iVar5 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    pcVar12 = "Time";
  }
  else {
    iVar5 = 10;
    putchar(10);
    local_60 = (double)p->clkSat;
    Abc_Print(iVar5,"%s =","SAT  ");
    Abc_Print(iVar5,"%9.2f sec\n",local_60 / 1000000.0);
    iVar7 = 3;
    iVar5 = clock_gettime(3,&local_78);
    lVar10 = -1;
    lVar11 = -1;
    if (-1 < iVar5) {
      lVar11 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    lVar2 = p->clkStart;
    lVar3 = p->clkSat;
    Abc_Print(iVar7,"%s =","Other");
    Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar11 - (lVar2 + lVar3)) / 1000000.0);
    iVar7 = 3;
    iVar5 = clock_gettime(3,&local_78);
    if (-1 < iVar5) {
      lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    pcVar12 = "TOTAL";
  }
  lVar11 = p->clkStart;
  Abc_Print(iVar7,"%s =",pcVar12);
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar10 - lVar11) / 1000000.0);
  Gia_QbfFree(p);
  return iVar14;
}

Assistant:

int Gia_QbfSolve( Gia_Man_t * pGia, int nPars, int nIterLimit, int nConfLimit, int nTimeOut, int nEncVars, int fGlucose, int fVerbose )
{
    Qbf_Man_t * p = Gia_QbfAlloc( pGia, nPars, fGlucose, fVerbose );
    Gia_Man_t * pCof;
    int i, status, RetValue = 0;
    abctime clk;
//    Gia_QbfAddSpecialConstr( p );
    if ( fVerbose )
        printf( "Solving QBF for \"%s\" with %d parameters, %d variables and %d AIG nodes.\n", 
            Gia_ManName(pGia), p->nPars, p->nVars, Gia_ManAndNum(pGia) );
    assert( Gia_ManRegNum(pGia) == 0 );
    Vec_IntFill( p->vValues, nPars, 0 );
    for ( i = 0; Gia_QbfVerify(p, p->vValues); i++ )
    {
        // generate next constraint
        assert( Vec_IntSize(p->vValues) == p->nVars );
        pCof = Gia_QbfCofactor( pGia, nPars, p->vValues, p->vParMap );
        status = p->pSatSynG ? Gia_QbfAddCofactorG( p, pCof ) : Gia_QbfAddCofactor( p, pCof );
        Gia_ManStop( pCof );
        if ( status == 0 )       { RetValue =  1; break; }
        // synthesize next assignment
        clk = Abc_Clock();
        if ( p->pSatSynG )
            status = bmcg_sat_solver_solve( p->pSatSynG, NULL, 0 );
        else
            status = sat_solver_solve( p->pSatSyn, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
        p->clkSat += Abc_Clock() - clk;
        if ( fVerbose )
            Gia_QbfPrint( p, p->vValues, i );
        if ( status == l_False ) { RetValue =  1; break; }
        if ( status == l_Undef ) { RetValue = -1; break; }
        // extract SAT assignment
        Gia_QbfOnePattern( p, p->vValues );
        assert( Vec_IntSize(p->vValues) == p->nPars );
        // examine variables
//        Gia_QbfLearnConstraint( p, p->vValues );
//        Vec_IntPrintBinary( p->vValues ); printf( "\n" );
        if ( nIterLimit && i+1 == nIterLimit ) { RetValue = -1; break; }
        if ( nTimeOut && (Abc_Clock() - p->clkStart)/CLOCKS_PER_SEC >= nTimeOut ) { RetValue = -1; break; }
    }
    if ( RetValue == 0 )
    {
        int nZeros = Vec_IntCountZero( p->vValues );
        printf( "Parameters: " );
        assert( Vec_IntSize(p->vValues) == nPars );
        Vec_IntPrintBinary( p->vValues );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(p->vValues) - nZeros );
        if ( nEncVars )
        {
            int nBits = Vec_IntSize(p->vValues)/(1 << nEncVars);
            assert( Vec_IntSize(p->vValues) == (1 << nEncVars) * nBits );
            Gia_Gen2CodePrint( nEncVars, nBits, p->vValues );
        }
    }
    if ( RetValue == -1 && nTimeOut && (Abc_Clock() - p->clkStart)/CLOCKS_PER_SEC >= nTimeOut )
        printf( "The problem timed out after %d sec.  ", nTimeOut );
    else if ( RetValue == -1 && nConfLimit )
        printf( "The problem aborted after %d conflicts.  ", nConfLimit );
    else if ( RetValue == -1 && nIterLimit )
        printf( "The problem aborted after %d iterations.  ", nIterLimit );
    else if ( RetValue == 1 )
        printf( "The problem is UNSAT after %d iterations.  ", i );
    else 
        printf( "The problem is SAT after %d iterations.  ", i );
    if ( fVerbose )
    {
        printf( "\n" );
        Abc_PrintTime( 1, "SAT  ", p->clkSat );
        Abc_PrintTime( 1, "Other", Abc_Clock() - p->clkStart - p->clkSat );
        Abc_PrintTime( 1, "TOTAL", Abc_Clock() - p->clkStart );
    }
    else
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    Gia_QbfFree( p );
    return RetValue;
}